

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

wstring * __thiscall
NJamSpell::TSpellCorrector::FixFragment
          (wstring *__return_storage_ptr__,TSpellCorrector *this,wstring *text)

{
  pointer pTVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  pointer pwVar6;
  ulong uVar7;
  wchar_t wVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pvVar11;
  long lVar12;
  pointer pwVar13;
  ulong uVar14;
  size_t position;
  undefined1 local_158 [8];
  TSentences origSentences;
  TWords candidates;
  wstring origLowered;
  undefined1 local_e0 [8];
  wstring lowered;
  TSentences sentences;
  wstring newWord;
  wstring origWord;
  TWords words;
  
  TLangModel::Tokenize((TSentences *)local_158,&this->LangModel,text);
  local_e0 = (undefined1  [8])&lowered._M_string_length;
  pwVar13 = (text->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)local_e0,pwVar13,pwVar13 + text->_M_string_length);
  ToLower((wstring *)local_e0);
  TLangModel::Tokenize
            ((TSentences *)((long)&lowered.field_2 + 8),&this->LangModel,(wstring *)local_e0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  wVar8 = (wchar_t)__return_storage_ptr__;
  if (sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)lowered.field_2._8_8_) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    uVar7 = 0;
    do {
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                 ((long)&origWord.field_2 + 8),
                 (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                 (lowered.field_2._8_8_ + uVar7 * 0x18));
      if (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)origWord.field_2._8_8_) {
        pvVar11 = (pointer)((long)local_158 + uVar7 * 0x18);
        position = 0;
        do {
          pTVar1 = (pvVar11->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar12 = position * 0x10;
          pwVar2 = pTVar1[position].Ptr;
          sVar3 = pTVar1[position].Len;
          origLowered.field_2._8_8_ = *(undefined8 *)(origWord.field_2._8_8_ + lVar12);
          lVar4 = *(long *)(origWord.field_2._8_8_ + 8 + lVar12);
          GetCandidatesRaw((TWords *)
                           &origSentences.
                            super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
                           (TWords *)((long)&origWord.field_2 + 8),position);
          if (candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)origSentences.
                       super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pTVar1 = ((origSentences.
                       super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            *(undefined8 *)(origWord.field_2._8_8_ + lVar12) =
                 ((origSentences.
                   super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            ((undefined8 *)(origWord.field_2._8_8_ + lVar12))[1] = pTVar1;
          }
          uVar14 = (long)pwVar2 - (long)(text->_M_dataplus)._M_p >> 2;
          uVar10 = uVar9;
          if (uVar9 < uVar14) {
            do {
              std::__cxx11::wstring::push_back(wVar8);
              uVar9 = uVar9 + 1;
              uVar10 = uVar14;
            } while (uVar14 != uVar9);
          }
          sentences.
          super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&newWord._M_string_length;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)
                     &sentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     *(long *)(origWord.field_2._8_8_ + lVar12),
                     *(long *)(origWord.field_2._8_8_ + lVar12) +
                     *(long *)(origWord.field_2._8_8_ + 8 + lVar12) * 4);
          newWord.field_2._8_8_ = &origWord._M_string_length;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)((long)&newWord.field_2 + 8),pwVar2,pwVar2 + sVar3);
          candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)&origLowered._M_string_length;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)
                     &candidates.
                      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,origLowered.field_2._8_8_,
                     origLowered.field_2._8_8_ + lVar4 * 4);
          if ((newWord._M_dataplus._M_p == origLowered._M_dataplus._M_p) &&
             ((newWord._M_dataplus._M_p == (pointer)0x0 ||
              (iVar5 = wmemcmp((wchar_t *)
                               sentences.
                               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (wchar_t *)
                               candidates.
                               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_t)newWord._M_dataplus._M_p), iVar5 == 0)))) {
            std::__cxx11::wstring::_M_append
                      ((wchar_t *)__return_storage_ptr__,newWord.field_2._8_8_);
          }
          else if (newWord._M_dataplus._M_p != (pointer)0x0) {
            pwVar13 = (pointer)0x0;
            do {
              pwVar6 = origWord._M_dataplus._M_p - 1;
              if (pwVar13 < origWord._M_dataplus._M_p) {
                pwVar6 = pwVar13;
              }
              MakeUpperIfRequired(*(wchar_t *)
                                   ((long)&((sentences.
                                             super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                           )._M_impl.super__Vector_impl_data._M_start +
                                   (long)pwVar13 * 4),
                                  *(wchar_t *)(newWord.field_2._8_8_ + (long)pwVar6 * 4));
              std::__cxx11::wstring::push_back(wVar8);
              pwVar13 = (pointer)((long)pwVar13 + 1);
            } while (pwVar13 < newWord._M_dataplus._M_p);
          }
          if (candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage !=
              (pointer)&origLowered._M_string_length) {
            operator_delete(candidates.
                            super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if ((size_type *)newWord.field_2._8_8_ != &origWord._M_string_length) {
            operator_delete((void *)newWord.field_2._8_8_);
          }
          if (sentences.
              super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
              (pointer)&newWord._M_string_length) {
            operator_delete(sentences.
                            super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (origSentences.
              super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(origSentences.
                            super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          uVar9 = uVar10 + sVar3;
          position = position + 1;
        } while (position <
                 (ulong)((long)words.
                               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                               ._M_impl.super__Vector_impl_data._M_start - origWord.field_2._8_8_ >>
                        4));
      }
      if (origWord.field_2._8_8_ != 0) {
        operator_delete((void *)origWord.field_2._8_8_);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)sentences.
                                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start -
                              lowered.field_2._8_8_ >> 3) * -0x5555555555555555));
  }
  for (; uVar9 < text->_M_string_length; uVar9 = uVar9 + 1) {
    std::__cxx11::wstring::push_back(wVar8);
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)((long)&lowered.field_2 + 8));
  if (local_e0 != (undefined1  [8])&lowered._M_string_length) {
    operator_delete((void *)local_e0);
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_158);
  return __return_storage_ptr__;
}

Assistant:

std::wstring TSpellCorrector::FixFragment(const std::wstring& text) const {
    TSentences origSentences = LangModel.Tokenize(text);
    std::wstring lowered = text;
    ToLower(lowered);
    TSentences sentences = LangModel.Tokenize(lowered);
    std::wstring result;
    size_t origPos = 0;
    for (size_t i = 0; i < sentences.size(); ++i) {
        TWords words = sentences[i];
        const TWords& origWords = origSentences[i];
        for (size_t j = 0; j < words.size(); ++j) {
            TWord orig = origWords[j];
            TWord lowered = words[j];
            TWords candidates = GetCandidatesRaw(words, j);
            if (candidates.size() > 0) {
                words[j] = candidates[0];
            }
            size_t currOrigPos = orig.Ptr - &text[0];
            while (origPos < currOrigPos) {
                result.push_back(text[origPos]);
                origPos += 1;
            }
            std::wstring newWord = std::wstring(words[j].Ptr, words[j].Len);
            std::wstring origWord = std::wstring(orig.Ptr, orig.Len);
            std::wstring origLowered = std::wstring(lowered.Ptr, lowered.Len);
            if (newWord != origLowered) {
                for (size_t k = 0; k < newWord.size(); ++k) {
                    size_t n = k < origWord.size() ? k : origWord.size() - 1;
                    wchar_t newChar = newWord[k];
                    wchar_t origChar = origWord[n];
                    result.push_back(MakeUpperIfRequired(newChar, origChar));
                }
            } else {
                result += origWord;
            }
            origPos += orig.Len;
        }
    }
    while (origPos < text.size()) {
        result.push_back(text[origPos]);
        origPos += 1;
    }
    return result;
}